

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

BOOL QueryPerformanceFrequency(LARGE_INTEGER *lpFrequency)

{
  BOOL retval;
  LARGE_INTEGER *lpFrequency_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  lpFrequency->QuadPart = 1000000000;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return 1;
}

Assistant:

BOOL
PALAPI
QueryPerformanceFrequency(
    OUT LARGE_INTEGER *lpFrequency
    )
{
    BOOL retval = TRUE;
    PERF_ENTRY(QueryPerformanceFrequency);
    ENTRY("QueryPerformanceFrequency()\n");

    lpFrequency->QuadPart = (LONGLONG)(tccSecondsToNanoSeconds);

    LOGEXIT("QueryPerformanceFrequency\n");
    PERF_EXIT(QueryPerformanceFrequency);
    return retval;
}